

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  size_t sVar1;
  int iVar2;
  void *pvVar3;
  size_t consumed;
  size_t local_40;
  size_t *local_38;
  
  if (tls->state < PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x124a,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
  }
  pvVar3 = (void *)(*inlen + (long)_input);
  sVar1 = decryptbuf->off;
  iVar2 = 0;
  local_38 = inlen;
  while (((iVar2 == 0 && (_input != pvVar3)) && (sVar1 == decryptbuf->off))) {
    local_40 = (long)pvVar3 - (long)_input;
    iVar2 = handle_input(tls,(ptls_message_emitter_t *)0x0,decryptbuf,_input,&local_40,
                         (ptls_handshake_properties_t *)0x0);
    _input = (void *)((long)_input + local_40);
    if (iVar2 == 0x202) {
      iVar2 = 0;
    }
  }
  *local_38 = (long)_input + (*local_38 - (long)pvVar3);
  return iVar2;
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);
    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}